

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O2

void VW::save_predictor(vw *all,string *reg_name)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)reg_name);
  dump_regressor(all,&local_30,false);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void save_predictor(vw& all, string reg_name) { dump_regressor(all, reg_name, false); }